

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictoc.h
# Opt level: O0

void __thiscall bsplib::TicToc::~TicToc(TicToc *this)

{
  reference pvVar1;
  Time TVar2;
  Time TVar3;
  Record *r;
  TicToc *this_local;
  
  pvVar1 = std::vector<bsplib::TicToc::Record,_std::allocator<bsplib::TicToc::Record>_>::operator[]
                     ((vector<bsplib::TicToc::Record,_std::allocator<bsplib::TicToc::Record>_> *)
                      s_timers,(ulong)this->m_record);
  TVar3 = pvVar1->time;
  TVar2 = getTime();
  TVar2 = timeDiff(TVar2,this->m_start);
  TVar3 = timeAdd(TVar3,TVar2);
  pvVar1->time = TVar3;
  pvVar1->nbytes = pvVar1->nbytes + this->m_nbytes;
  pvVar1->count = pvVar1->count + 1;
  pop();
  return;
}

Assistant:

~TicToc()
    {
        Record & r = s_timers[m_record];
        r.time = timeAdd( r.time, 
                timeDiff( getTime(), m_start ) );
        r.nbytes += m_nbytes;
        r.count += 1;
        pop();
    }